

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *positionalMode,bool *spacePadPositive,int *ntrunc,
                 char *fmtStart,FormatArg *args,int *argIndex,int numArgs)

{
  byte bVar1;
  bool bVar2;
  _func_int **pp_Var3;
  runtime_error *prVar4;
  _func_int *p_Var5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  int precision;
  byte *local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*fmtStart != '%') {
    __assert_fail("*fmtStart == \'%\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/tinyformat.h"
                  ,0x29a,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  pp_Var3 = out->_vptr_basic_ostream;
  *(undefined8 *)(&out->field_0x10 + (long)pp_Var3[-3]) = 0;
  *(undefined8 *)(&out->field_0x8 + (long)pp_Var3[-3]) = 6;
  p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var3[-3]);
  if ((&out->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
    std::ios::widen((char)p_Var5);
    p_Var5[0xe1] = (code)0x1;
    pp_Var3 = out->_vptr_basic_ostream;
  }
  p_Var5[0xe0] = (code)0x20;
  *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
       *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xffffb000;
  pbVar9 = (byte *)(fmtStart + 1);
  bVar1 = fmtStart[1];
  if ((byte)(bVar1 - 0x30) < 10) {
    iVar11 = 0;
    local_60 = (byte *)(fmtStart + 2);
    bVar7 = bVar1;
    do {
      pbVar9 = local_60;
      iVar11 = (uint)(byte)(bVar7 - 0x30) + iVar11 * 10;
      bVar7 = *pbVar9;
      local_60 = pbVar9 + 1;
    } while ((byte)(bVar7 - 0x30) < 10);
    if (bVar7 == 0x24) {
      if ((0 < iVar11) && (iVar11 <= numArgs)) {
        *argIndex = iVar11 + -1;
        *positionalMode = true;
        pbVar9 = local_60;
        goto LAB_0024efaf;
      }
      local_60 = pbVar9;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"tinyformat: Positional argument out of range","");
      std::runtime_error::runtime_error(prVar4,(string *)local_58);
      *(undefined ***)prVar4 = &PTR__runtime_error_013adfe0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (*positionalMode != true) {
        local_60 = pbVar9;
        if (bVar1 == 0x30) {
          p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var3[-3]);
          if ((&out->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
            std::ios::widen((char)p_Var5);
            p_Var5[0xe1] = (code)0x1;
            pp_Var3 = out->_vptr_basic_ostream;
          }
          p_Var5[0xe0] = (code)0x30;
          *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
               *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xffffff4f | 0x10;
        }
        if (iVar11 != 0) {
          *(long *)(&out->field_0x10 + (long)pp_Var3[-3]) = (long)iVar11;
          bVar2 = true;
          uVar12 = 0;
          goto LAB_0024f15c;
        }
LAB_0024efaf:
        uVar6 = 0;
        pbVar10 = local_60;
LAB_0024efbb:
        while( true ) {
          while( true ) {
            local_60 = pbVar10;
            pbVar10 = pbVar9 + 1;
            bVar1 = *pbVar9;
            pbVar9 = pbVar10;
            if (0x2a < bVar1) break;
            if (bVar1 == 0x20) {
              if (((&out->field_0x19)[(long)pp_Var3[-3]] & 8) == 0) {
                *spacePadPositive = true;
              }
            }
            else {
              if (bVar1 != 0x23) goto LAB_0024f0b9;
              *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
                   *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x600;
            }
          }
          if (bVar1 != 0x2b) break;
          *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
               *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x800;
          *spacePadPositive = false;
          uVar6 = 1;
        }
        if (bVar1 == 0x2d) {
          p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var3[-3]);
          if ((&out->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
            std::ios::widen((char)p_Var5);
            p_Var5[0xe1] = (code)0x1;
            pp_Var3 = out->_vptr_basic_ostream;
          }
          p_Var5[0xe0] = (code)0x20;
          p_Var5 = pp_Var3[-3];
          uVar8 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xffffff4f | 0x20;
        }
        else {
          if (bVar1 != 0x30) goto LAB_0024f0b9;
          if (((&out->field_0x18)[(long)pp_Var3[-3]] & 0x20) != 0) goto LAB_0024efbb;
          p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var3[-3]);
          if (p_Var5[0xe1] == (_func_int)0x0) {
            std::ios::widen((char)p_Var5);
            p_Var5[0xe1] = (code)0x1;
            pp_Var3 = out->_vptr_basic_ostream;
          }
          p_Var5[0xe0] = (code)0x30;
          p_Var5 = pp_Var3[-3];
          uVar8 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xffffff4f | 0x10;
        }
        *(uint *)(&out->field_0x18 + (long)p_Var5) = uVar8;
        goto LAB_0024efbb;
      }
      local_60 = pbVar9;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "tinyformat: Non-positional argument used after a positional one","");
      std::runtime_error::runtime_error(prVar4,(string *)local_58);
      *(undefined ***)prVar4 = &PTR__runtime_error_013adfe0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    local_60 = pbVar9;
    if (*positionalMode != true) goto LAB_0024efaf;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"tinyformat: Non-positional argument used after a positional one",
               "");
    std::runtime_error::runtime_error(prVar4,(string *)local_58);
    *(undefined ***)prVar4 = &PTR__runtime_error_013adfe0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  goto LAB_0024f71f;
LAB_0024f0b9:
  local_58[0] = (undefined1 *)((ulong)local_58[0] & 0xffffffff00000000);
  bVar2 = parseWidthOrPrecision
                    ((int *)local_58,(char **)&local_60,*positionalMode,args,argIndex,numArgs);
  if (bVar2) {
    pp_Var3 = out->_vptr_basic_ostream;
    iVar11 = (int)local_58[0];
    if ((int)local_58[0] < 0) {
      p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var3[-3]);
      if ((&out->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
        std::ios::widen((char)p_Var5);
        p_Var5[0xe1] = (code)0x1;
        pp_Var3 = out->_vptr_basic_ostream;
      }
      p_Var5[0xe0] = (code)0x20;
      *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
           *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xffffff4f | 0x20;
      iVar11 = -(int)local_58[0];
    }
    *(long *)(&out->field_0x10 + (long)pp_Var3[-3]) = (long)iVar11;
  }
  uVar12 = (ulong)uVar6;
  pbVar9 = local_60;
LAB_0024f15c:
  if (*pbVar9 == 0x2e) {
    local_60 = pbVar9 + 1;
    local_58[0] = (undefined1 *)((ulong)local_58[0] & 0xffffffff00000000);
    parseWidthOrPrecision((int *)local_58,(char **)&local_60,*positionalMode,args,argIndex,numArgs);
    bVar13 = -1 < (long)(int)local_58[0];
    pbVar9 = local_60;
    if (bVar13) {
      *(long *)(&out->field_0x8 + (long)out->_vptr_basic_ostream[-3]) = (long)(int)local_58[0];
    }
  }
  else {
    bVar13 = false;
  }
LAB_0024f1c4:
  bVar1 = *pbVar9;
  switch(bVar1) {
  case 0x45:
    pp_Var3 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x4000;
LAB_0024f361:
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xfffffefb | 0x100;
    p_Var5 = pp_Var3[-3];
    uVar6 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xffffffb5 | 2;
LAB_0024f3de:
    *(uint *)(&out->field_0x18 + (long)p_Var5) = uVar6;
    goto switchD_0024f1db_caseD_48;
  case 0x46:
    pp_Var3 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x4000;
    goto LAB_0024f3ce;
  case 0x47:
    pp_Var3 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x4000;
    goto LAB_0024f397;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 99:
  case 0x6b:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x76:
  case 0x77:
  case 0x79:
    goto switchD_0024f1db_caseD_48;
  case 0x4c:
  case 0x68:
  case 0x6a:
  case 0x6c:
  case 0x74:
  case 0x7a:
    goto switchD_0024f1db_caseD_4c;
  case 0x58:
    pp_Var3 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x4000;
    goto LAB_0024f324;
  case 0x61:
    pp_Var3 = out->_vptr_basic_ostream;
    goto LAB_0024f473;
  case 100:
  case 0x69:
  case 0x75:
    pp_Var3 = out->_vptr_basic_ostream;
    uVar6 = 2;
    break;
  case 0x65:
    pp_Var3 = out->_vptr_basic_ostream;
    goto LAB_0024f361;
  case 0x66:
    pp_Var3 = out->_vptr_basic_ostream;
LAB_0024f3ce:
    p_Var5 = pp_Var3[-3];
    uVar6 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xfffffefb | 4;
    goto LAB_0024f3de;
  case 0x67:
    pp_Var3 = out->_vptr_basic_ostream;
LAB_0024f397:
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 2;
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xfffffefb;
    goto switchD_0024f1db_caseD_48;
  case 0x6e:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"tinyformat: %n conversion spec not supported","");
    std::runtime_error::runtime_error(prVar4,(string *)local_58);
    *(undefined ***)prVar4 = &PTR__runtime_error_013adfe0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0024f71f;
  case 0x6f:
    pp_Var3 = out->_vptr_basic_ostream;
    uVar6 = 0x40;
    break;
  case 0x70:
  case 0x78:
    pp_Var3 = out->_vptr_basic_ostream;
LAB_0024f324:
    uVar6 = 8;
    break;
  case 0x73:
    pp_Var3 = out->_vptr_basic_ostream;
    if (bVar13) {
      *ntrunc = *(int *)(&out->field_0x8 + (long)pp_Var3[-3]);
    }
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 1;
    goto switchD_0024f1db_caseD_48;
  default:
    if (bVar1 != 0x41) {
      if (bVar1 != 0) goto switchD_0024f1db_caseD_48;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "tinyformat: Conversion spec incorrectly terminated by end of string","");
      std::runtime_error::runtime_error(prVar4,(string *)local_58);
      *(undefined ***)prVar4 = &PTR__runtime_error_013adfe0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0024f71f;
    }
    pp_Var3 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x4000;
LAB_0024f473:
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) | 0x104;
    goto switchD_0024f1db_caseD_48;
  }
  *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
       *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | uVar6;
  if (bVar2 == false && bVar13) {
    *(ulong *)(&out->field_0x10 + (long)pp_Var3[-3]) =
         uVar12 + *(long *)(&out->field_0x8 + (long)pp_Var3[-3]);
    *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var3[-3]) & 0xffffff4f | 0x10;
    p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var3[-3]);
    if ((&out->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
      std::ios::widen((char)p_Var5);
      p_Var5[0xe1] = (code)0x1;
      pbVar9 = local_60;
    }
    p_Var5[0xe0] = (code)0x30;
  }
  goto switchD_0024f1db_caseD_48;
switchD_0024f1db_caseD_4c:
  local_60 = pbVar9 + 1;
  pbVar9 = local_60;
  goto LAB_0024f1c4;
switchD_0024f1db_caseD_48:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (char *)(pbVar9 + 1);
  }
LAB_0024f71f:
  __stack_chk_fail();
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& positionalMode,
                                         bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* args,
                                         int& argIndex, int numArgs)
{
    TINYFORMAT_ASSERT(*fmtStart == '%');
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;

    // 1) Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag.
    if (*c >= '0' && *c <= '9') {
        const char tmpc = *c;
        int value = parseIntAndAdvance(c);
        if (*c == '$') {
            // value is an argument index
            if (value > 0 && value <= numArgs)
                argIndex = value - 1;
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
            positionalMode = true;
        }
        else if (positionalMode) {
            TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
        }
        else {
            if (tmpc == '0') {
                // Use internal padding so that numeric values are
                // formatted correctly, eg -00010 rather than 000-10
                out.fill('0');
                out.setf(std::ios::internal, std::ios::adjustfield);
            }
            if (value != 0) {
                // Nonzero value means that we parsed width.
                widthSet = true;
                out.width(value);
            }
        }
    }
    else if (positionalMode) {
        TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
    }
    // 2) Parse flags and width if we did not do it in previous step.
    if (!widthSet) {
        // Parse flags
        for (;; ++c) {
            switch (*c) {
                case '#':
                    out.setf(std::ios::showpoint | std::ios::showbase);
                    continue;
                case '0':
                    // overridden by left alignment ('-' flag)
                    if (!(out.flags() & std::ios::left)) {
                        // Use internal padding so that numeric values are
                        // formatted correctly, eg -00010 rather than 000-10
                        out.fill('0');
                        out.setf(std::ios::internal, std::ios::adjustfield);
                    }
                    continue;
                case '-':
                    out.fill(' ');
                    out.setf(std::ios::left, std::ios::adjustfield);
                    continue;
                case ' ':
                    // overridden by show positive sign, '+' flag.
                    if (!(out.flags() & std::ios::showpos))
                        spacePadPositive = true;
                    continue;
                case '+':
                    out.setf(std::ios::showpos);
                    spacePadPositive = false;
                    widthExtra = 1;
                    continue;
                default:
                    break;
            }
            break;
        }
        // Parse width
        int width = 0;
        widthSet = parseWidthOrPrecision(width, c, positionalMode,
                                         args, argIndex, numArgs);
        if (widthSet) {
            if (width < 0) {
                // negative widths correspond to '-' flag set
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                width = -width;
            }
            out.width(width);
        }
    }
    // 3) Parse precision
    if (*c == '.') {
        ++c;
        int precision = 0;
        parseWidthOrPrecision(precision, c, positionalMode,
                              args, argIndex, numArgs);
        // Presence of `.` indicates precision set, unless the inferred value
        // was negative in which case the default is used.
        precisionSet = precision >= 0;
        if (precisionSet)
            out.precision(precision);
    }
    // 4) Ignore any C99 length modifier
    while (*c == 'l' || *c == 'h' || *c == 'L' ||
           *c == 'j' || *c == 'z' || *c == 't') {
        ++c;
    }
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch (*c) {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'A':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'a':
#           ifdef _MSC_VER
            // Workaround https://developercommunity.visualstudio.com/content/problem/520472/hexfloat-stream-output-does-not-ignore-precision-a.html
            // by always setting maximum precision on MSVC to avoid precision
            // loss for doubles.
            out.precision(13);
#           endif
            out.setf(std::ios::fixed | std::ios::scientific, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if (precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print Booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if (intConversion && precisionSet && !widthSet) {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}